

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

DdNode * Llb4_Nonlin4SweepBadMonitor(Aig_Man_t *pAig,Vec_Int_t *vOrder,DdManager *dd)

{
  abctime aVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  DdNode *pDVar3;
  abctime TimeStop;
  int i;
  DdNode *bTemp;
  DdNode *bVar;
  DdNode *bRes;
  Aig_Obj_t *pObj;
  DdManager *dd_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  bVar = Cudd_ReadOne(dd);
  Cudd_Ref(bVar);
  for (TimeStop._4_4_ = 0; iVar2 = Saig_ManPoNum(pAig), TimeStop._4_4_ < iVar2;
      TimeStop._4_4_ = TimeStop._4_4_ + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,TimeStop._4_4_);
    iVar2 = Llb_ObjBddVar(vOrder,pObj_00);
    pDVar3 = Cudd_bddIthVar(dd,iVar2);
    pDVar3 = Cudd_bddAnd(dd,bVar,(DdNode *)((ulong)pDVar3 ^ 1));
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,bVar);
    bVar = pDVar3;
  }
  Cudd_Deref(bVar);
  dd->TimeStop = aVar1;
  return (DdNode *)((ulong)bVar ^ 1);
}

Assistant:

DdNode * Llb4_Nonlin4SweepBadMonitor( Aig_Man_t * pAig, Vec_Int_t * vOrder, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i;
    abctime TimeStop;
    TimeStop = dd->TimeStop;  dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        bVar = Cudd_bddIthVar( dd, Llb_ObjBddVar(vOrder, pObj) );
        bRes = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return Cudd_Not(bRes);
}